

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnv_hash.c
# Opt level: O0

uint32_t fnv1_hash_data(void *data,size_t size)

{
  byte *local_28;
  uint8_t *bytes;
  size_t sStack_18;
  uint32_t hash;
  size_t size_local;
  void *data_local;
  
  bytes._4_4_ = 0x811c9dc5;
  local_28 = (byte *)data;
  sStack_18 = size;
  while (sStack_18 != 0) {
    bytes._4_4_ = (*local_28 ^ bytes._4_4_) * 0x1000193;
    local_28 = local_28 + 1;
    sStack_18 = sStack_18 - 1;
  }
  return bytes._4_4_;
}

Assistant:

uint32_t
fnv1_hash_data(const void *data, size_t size)
{
	uint32_t hash = 2166136261ul;
	const uint8_t *bytes = (uint8_t *)data;

	while (size-- != 0) {
		hash ^= *bytes;
		hash = hash * 0x01000193;
		bytes++;
	}

	return hash;
}